

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O1

ostream * Hpipe::cc(ostream *os,int r)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  char local_19;
  
  if (r == 0x5c) {
    pcVar3 = "\'\\\\\'";
    lVar2 = 4;
  }
  else {
    if (r == 0x27 || 0x5e < r - 0x20U) {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,r);
      return poVar1;
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
    local_19 = (char)r;
    os = std::__ostream_insert<char,std::char_traits<char>>(os,&local_19,1);
    lVar2 = 1;
    pcVar3 = "\'";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,lVar2);
  return os;
}

Assistant:

static std::ostream &cc( std::ostream &os, int r ) {
    if ( r == '\\' )
        return os << "'\\\\'";
    if ( r >= 0x20 and r <= 0x7e and r != 39 )
        return os << "'" << char( r ) << "'";
    return os << r;
}